

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.h
# Opt level: O1

void __thiscall Rml::Property::Property(Property *this,Property *param_1)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  PropertyDefinition *pPVar2;
  int iVar3;
  
  Variant::Variant(&this->value,&param_1->value);
  this->parser_index = param_1->parser_index;
  iVar3 = param_1->specificity;
  pPVar2 = param_1->definition;
  this->unit = param_1->unit;
  this->specificity = iVar3;
  this->definition = pPVar2;
  (this->source).super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (param_1->source).super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  p_Var1 = (param_1->source).
           super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->source).super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  return;
}

Assistant:

class RMLUICORE_API Property {
public:
	Property();
	template <typename PropertyType>
	Property(PropertyType value, Unit unit, int specificity = -1) : value(value), unit(unit), specificity(specificity)
	{
		definition = nullptr;
		parser_index = -1;
	}
	template <typename EnumType, typename = typename std::enable_if_t<std::is_enum<EnumType>::value, EnumType>>
	Property(EnumType value) : value(static_cast<int>(value)), unit(Unit::KEYWORD), specificity(-1)
	{}

	/// Get the value of the property as a string.
	String ToString() const;

	/// Get the value of the property as a numeric value, if applicable.
	NumericValue GetNumericValue() const;

	/// Templatised accessor.
	template <typename T>
	T Get() const
	{
		return value.Get<T>();
	}

	bool operator==(const Property& other) const { return unit == other.unit && value == other.value; }
	bool operator!=(const Property& other) const { return !(*this == other); }

	Variant value;
	Unit unit;
	int specificity;

	const PropertyDefinition* definition = nullptr;
	int parser_index = -1;

	SharedPtr<const PropertySource> source;
}